

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.cpp
# Opt level: O0

ScoreMap *
InferExamAnswers::Algorithm::computeScoreMap(ExamResults *examResults,uint8_t n,uint8_t m)

{
  byte bVar1;
  mapped_type *this;
  unsigned_long *puVar2;
  uchar *puVar3;
  byte *pbVar4;
  type_conflict *ptVar5;
  pointer ppVar6;
  char in_CL;
  uint uVar7;
  byte in_DL;
  valarray<unsigned_long> *in_RSI;
  ScoreMap *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_false,_true>,_bool>
  pVar8;
  type_conflict *inserted;
  type *it;
  SolutionCollection collection_1;
  uint64_t correctAnswers;
  uint8_t j;
  valarray<unsigned_char> score_1;
  bool keepSolution;
  uint32_t i;
  SolutionCollection collection;
  valarray<unsigned_char> score;
  uint64_t scoreMask;
  uint64_t solutionsToCheck;
  uint8_t otherSequenceLength;
  uint8_t currentSequenceLength;
  ScoreMap *scoreMap;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  _Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
  in_stack_fffffffffffffe70;
  size_type in_stack_fffffffffffffe78;
  value_type *__x;
  undefined4 in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe84;
  value_type local_b0;
  valarray<unsigned_char> local_88;
  byte local_71;
  uint local_70;
  undefined4 local_6c;
  SolutionCollection local_68 [2];
  byte local_29;
  ulong local_28;
  ulong local_20;
  byte local_14;
  byte local_13;
  byte local_11;
  valarray<unsigned_long> *local_10;
  
  local_13 = in_CL - in_DL;
  local_14 = (char)(int)in_RSI[2]._M_size - local_13;
  local_20 = 1L << (local_13 & 0x3f);
  local_28 = local_20 - 1;
  local_29 = 0;
  local_11 = in_DL;
  local_10 = in_RSI;
  std::
  allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>::
  allocator((allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>
             *)0x131c52);
  std::
  unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
  ::unordered_map((unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  in_stack_fffffffffffffe78,(hasher *)in_stack_fffffffffffffe70._M_cur,
                  (key_equal *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                  (allocator_type *)0x131c7c);
  std::
  allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>::
  ~allocator((allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>
              *)0x131c8b);
  if (local_13 == 0) {
    std::valarray<unsigned_char>::valarray
              ((valarray<unsigned_char> *)in_stack_fffffffffffffe70._M_cur,
               CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    local_68[0]._vptr_SolutionCollection = (_func_int **)0x0;
    local_68[0].solution = 0;
    local_68[0].size = 0;
    SolutionCollection::SolutionCollection(local_68);
    SolutionCollection::addSolution(local_68,0);
    this = std::
           unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
           ::operator[]((unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
                         *)in_stack_fffffffffffffe70._M_cur,
                        (key_type *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    SolutionCollection::operator=(this,local_68);
    local_29 = 1;
    local_6c = 1;
    SolutionCollection::~SolutionCollection(local_68);
    std::valarray<unsigned_char>::~valarray
              ((valarray<unsigned_char> *)in_stack_fffffffffffffe70._M_cur);
  }
  else {
    for (local_70 = 0; local_70 < local_20; local_70 = local_70 + 1) {
      local_71 = 1;
      std::valarray<unsigned_char>::valarray
                ((valarray<unsigned_char> *)in_stack_fffffffffffffe70._M_cur,
                 CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
      for (local_b0.second.size._7_1_ = 0;
          local_b0.second.size._7_1_ < *(byte *)((long)&local_10[2]._M_size + 1);
          local_b0.second.size._7_1_ = local_b0.second.size._7_1_ + 1) {
        puVar2 = std::valarray<unsigned_long>::operator[]
                           (local_10,(ulong)local_b0.second.size._7_1_);
        local_b0.second.solution = ~(*puVar2 >> (local_11 & 0x3f) ^ (ulong)local_70) & local_28;
        uVar7 = (uint)local_b0.second.solution - ((uint)local_b0.second.solution >> 1 & 0x55555555);
        uVar7 = (uVar7 & 0x33333333) + (uVar7 >> 2 & 0x33333333);
        puVar3 = std::valarray<unsigned_char>::operator[]
                           (&local_88,(ulong)local_b0.second.size._7_1_);
        *puVar3 = (uchar)((uVar7 + (uVar7 >> 4) & 0xf0f0f0f) * 0x1010101 >> 0x18);
        pbVar4 = std::valarray<unsigned_char>::operator[]
                           (&local_88,(ulong)local_b0.second.size._7_1_);
        bVar1 = *pbVar4;
        uVar7 = (uint)local_14;
        pbVar4 = std::valarray<unsigned_char>::operator[]
                           ((valarray<unsigned_char> *)(local_10 + 1),
                            (ulong)local_b0.second.size._7_1_);
        if (bVar1 + uVar7 < (uint)*pbVar4) {
LAB_00131fa2:
          local_71 = 0;
          break;
        }
        pbVar4 = std::valarray<unsigned_char>::operator[]
                           (&local_88,(ulong)local_b0.second.size._7_1_);
        in_stack_fffffffffffffe84 = (uint)*pbVar4;
        pbVar4 = std::valarray<unsigned_char>::operator[]
                           ((valarray<unsigned_char> *)(local_10 + 1),
                            (ulong)local_b0.second.size._7_1_);
        if ((int)(uint)*pbVar4 < (int)in_stack_fffffffffffffe84) goto LAB_00131fa2;
      }
      if ((local_71 & 1) == 0) {
        local_6c = 4;
      }
      else {
        __x = &local_b0;
        SolutionCollection::SolutionCollection((SolutionCollection *)__x);
        SolutionCollection::addSolution((SolutionCollection *)__x,(ulong)local_70);
        std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>::
        pair<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_true>
                  ((pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection> *
                   )CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),&__x->first,
                   (SolutionCollection *)in_stack_fffffffffffffe70._M_cur);
        pVar8 = std::
                unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
                ::insert((unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),__x);
        in_stack_fffffffffffffe70._M_cur =
             (__node_type *)
             pVar8.first.
             super__Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
             ._M_cur;
        in_stack_fffffffffffffe6f = pVar8.second;
        std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>::~pair
                  ((pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection> *
                   )in_stack_fffffffffffffe70._M_cur);
        std::
        get<0ul,std::__detail::_Node_iterator<std::pair<std::valarray<unsigned_char>const,InferExamAnswers::SolutionCollection>,false,true>,bool>
                  ((pair<std::__detail::_Node_iterator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_false,_true>,_bool>
                    *)0x1320a9);
        ptVar5 = std::
                 get<1ul,std::__detail::_Node_iterator<std::pair<std::valarray<unsigned_char>const,InferExamAnswers::SolutionCollection>,false,true>,bool>
                           ((pair<std::__detail::_Node_iterator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_false,_true>,_bool>
                             *)0x1320be);
        if ((*ptVar5 & 1U) == 0) {
          ppVar6 = std::__detail::
                   _Node_iterator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_false,_true>
                   ::operator->((_Node_iterator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_false,_true>
                                 *)0x1320e0);
          SolutionCollection::grow(&ppVar6->second,1);
        }
        SolutionCollection::~SolutionCollection((SolutionCollection *)&local_b0);
        local_6c = 0;
      }
      std::valarray<unsigned_char>::~valarray
                ((valarray<unsigned_char> *)in_stack_fffffffffffffe70._M_cur);
    }
    std::
    unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
    ::size((unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
            *)0x1321a0);
    std::
    unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
    ::rehash((unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
              *)in_stack_fffffffffffffe70._M_cur,
             CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    local_29 = 1;
    local_6c = 1;
  }
  if ((local_29 & 1) == 0) {
    std::
    unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
    ::~unordered_map((unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
                      *)0x1321d6);
  }
  return in_RDI;
}

Assistant:

Algorithm::ScoreMap Algorithm::computeScoreMap(const ExamResults& examResults, const uint8_t n, const uint8_t m)
{
	/**
	 *  Compute the length of the answers to create for the current partition
	 *  and the also compute the length of the anwers for the other partition.
	 */
	const uint8_t currentSequenceLength = m - n;
	const uint8_t otherSequenceLength = examResults.questionCount - currentSequenceLength;

	/**
	 * We have to check 2^currentSequenceLength solutions.
	 * So we create that number so we can use it as the upper
	 * limit in a for loop.
	 */
	const uint64_t solutionsToCheck = 1UL << currentSequenceLength;

	/**
	 * Since we are checking a subset of the total answers
	 * of a student we might have some extra bits from other
	 * answers we need to disregard. This mask uses can be used
	 * to filter out only the bits of the current subset since
	 * it contains currentSequenceLength number of 1 bits
	 */
	const uint64_t scoreMask = solutionsToCheck - 1UL;

	/**
	 * Initial bucket count will be the amount of possible solutions so a rehash
	 * will never occur while trying solutions.
	 */
	ScoreMap scoreMap(solutionsToCheck);

	/**
	 * If the length of the current partition is 0 no solution would be checked.
	 * However there still is a correct in that case. One with 0 solutions
	 */
	if (currentSequenceLength == 0) {
		std::valarray<uint8_t> score(examResults.studentCount);

		auto collection = SolutionCollection();
		collection.addSolution(0);
		scoreMap[std::move(score)] = std::move(collection);
		return scoreMap;
	}

	/**
	 * We create every possible solution from 0 to 2^n
	 * Verify if the resulting score with that solution
	 * still makes it possible to obtain the actual score
	 * the student got.
	 */
	for (uint32_t i = 0; i < solutionsToCheck; ++i) {
		auto keepSolution = true;
		std::valarray<uint8_t> score(examResults.studentCount);

		for (uint8_t j = 0; j < examResults.studentCount; ++j) {
			/**
			 * To obtain the score a student has obtained given a solution and the answer
			 * We first have to bitshift the solution over the current answers we are going
			 * to check. Then we apply a XOR operation. This results in a bit string that
			 * will contain a 1 if the answer didn't match and a 0 if it did match. So we
			 * negate that result. However since this result can still contain answers
			 * from the partition that we are currently disregarding we have to mask them
			 * out using the scoreMask.
			 *
			 * Now finally we need to count the amount of set bits in the resulting bit string.
			 * For this we use the special builtin function popcount which actually results
			 * in a single assembly instruction on modern hardware.
			 */
			const uint64_t correctAnswers = ~((examResults.answers[j] >> n) ^ i) & scoreMask;
			score[j] = __builtin_popcount(correctAnswers);

			/**
			 * The solution will be thrown away if the current
			 * score plus the perfect score for the other partition
			 * is smaller then the required score because there is no way
			 * to obtain the required score then.
			 * The same applies if the score exceeds the required score.
			 */
			if (score[j] + otherSequenceLength < examResults.scores[j] || score[j] > examResults.scores[j]) {
				keepSolution = false;
				break;
			}
		}

		if (!keepSolution) {
			continue;
		}

		SolutionCollection collection;
		collection.addSolution(i);

		// Clang-tidy sees this as a dead store but it's a false positive
		auto [it, inserted] = scoreMap.insert({std::move(score), std::move(collection)}); // NOLINT
		if (!inserted) {
			it->second.grow(1);
		}
	}

	/**
	 * Rehashing will remove unused buckets. Since after this the map will not
	 * be mutated further this will improve iteration speed when combining the
	 * partitions
	 */
	scoreMap.rehash(scoreMap.size());

	return scoreMap;
}